

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

bool __thiscall UniValue::pushKVs(UniValue *this,UniValue *obj)

{
  pointer pUVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  pointer pbVar6;
  ulong uVar7;
  long lVar8;
  
  bVar2 = obj->typ == VOBJ;
  bVar3 = this->typ == VOBJ;
  if ((bVar2 && bVar3) &&
     (pbVar6 = (obj->keys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (obj->keys).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != pbVar6)) {
    lVar5 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      pUVar1 = (obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3;
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->keys,(value_type *)((long)&(pbVar6->_M_dataplus)._M_p + lVar8));
      std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                (&this->values,(value_type *)((long)&pUVar1->typ + lVar5));
      uVar7 = uVar7 + 1;
      pbVar6 = (obj->keys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
      lVar5 = lVar5 + 0x58;
    } while (uVar7 < (ulong)((long)(obj->keys).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5));
  }
  return bVar2 && bVar3;
}

Assistant:

bool UniValue::pushKVs(const UniValue& obj)
{
    if (typ != VOBJ || obj.typ != VOBJ)
        return false;

    for (size_t i = 0; i < obj.keys.size(); i++)
        __pushKV(obj.keys[i], obj.values.at(i));

    return true;
}